

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zStream.c
# Opt level: O0

SRes LookToRead_Look_Exact(void *pp,void **buf,size_t *size)

{
  ulong *in_RDX;
  long *in_RSI;
  long in_RDI;
  size_t size2;
  CLookToRead *p;
  SRes res;
  undefined8 local_30;
  undefined4 local_1c;
  
  local_1c = 0;
  local_30 = *(long *)(in_RDI + 0x30) - *(long *)(in_RDI + 0x28);
  if ((local_30 == 0) && (*in_RDX != 0)) {
    *(undefined8 *)(in_RDI + 0x28) = 0;
    if (0x4000 < *in_RDX) {
      *in_RDX = 0x4000;
    }
    local_1c = (*(code *)**(undefined8 **)(in_RDI + 0x20))
                         (*(undefined8 *)(in_RDI + 0x20),in_RDI + 0x38,in_RDX);
    local_30 = *in_RDX;
    *(ulong *)(in_RDI + 0x30) = local_30;
  }
  if (local_30 < *in_RDX) {
    *in_RDX = local_30;
  }
  *in_RSI = in_RDI + 0x38 + *(long *)(in_RDI + 0x28);
  return local_1c;
}

Assistant:

static SRes LookToRead_Look_Exact(void *pp, const void **buf, size_t *size)
{
  SRes res = SZ_OK;
  CLookToRead *p = (CLookToRead *)pp;
  size_t size2 = p->size - p->pos;
  if (size2 == 0 && *size > 0)
  {
    p->pos = 0;
    if (*size > LookToRead_BUF_SIZE)
      *size = LookToRead_BUF_SIZE;
    res = p->realStream->Read(p->realStream, p->buf, size);
    size2 = p->size = *size;
  }
  if (size2 < *size)
    *size = size2;
  *buf = p->buf + p->pos;
  return res;
}